

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O0

void rb_insert_fixup(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  lgx_rb_node_s *plVar1;
  lgx_rb_node_t *node_00;
  lgx_rb_node_t *node_01;
  bool bVar2;
  lgx_rb_node_t *tmp_1;
  lgx_rb_node_t *uncle_1;
  lgx_rb_node_t *tmp;
  lgx_rb_node_t *uncle;
  lgx_rb_node_t *gparent;
  lgx_rb_node_t *parent;
  lgx_rb_node_t *node_local;
  lgx_rb_t *rbt_local;
  
  parent = node;
  while( true ) {
    node_01 = (lgx_rb_node_t *)(parent->parent_color & 0xfffffffffffffffc);
    bVar2 = false;
    if (node_01 != (lgx_rb_node_t *)0x0) {
      bVar2 = (node_01->parent_color & 1) == 0;
    }
    if (!bVar2) break;
    node_00 = (lgx_rb_node_t *)(node_01->parent_color & 0xfffffffffffffffc);
    gparent = node_01;
    if (node_01 == node_00->left) {
      plVar1 = node_00->right;
      if ((plVar1 == (lgx_rb_node_s *)0x0) || ((plVar1->parent_color & 1) != 0)) {
        if (node_01->right == parent) {
          rb_rotate_left(rbt,node_01);
          gparent = parent;
          parent = node_01;
        }
        gparent->parent_color = gparent->parent_color | 1;
        node_00->parent_color = node_00->parent_color & 0xfffffffffffffffe;
        rb_rotate_right(rbt,node_00);
      }
      else {
        plVar1->parent_color = plVar1->parent_color | 1;
        node_01->parent_color = node_01->parent_color | 1;
        node_00->parent_color = node_00->parent_color & 0xfffffffffffffffe;
        parent = node_00;
      }
    }
    else {
      plVar1 = node_00->left;
      if ((plVar1 == (lgx_rb_node_s *)0x0) || ((plVar1->parent_color & 1) != 0)) {
        if (node_01->left == parent) {
          rb_rotate_right(rbt,node_01);
          gparent = parent;
          parent = node_01;
        }
        gparent->parent_color = gparent->parent_color | 1;
        node_00->parent_color = node_00->parent_color & 0xfffffffffffffffe;
        rb_rotate_left(rbt,node_00);
      }
      else {
        plVar1->parent_color = plVar1->parent_color | 1;
        node_01->parent_color = node_01->parent_color | 1;
        node_00->parent_color = node_00->parent_color & 0xfffffffffffffffe;
        parent = node_00;
      }
    }
  }
  rbt->root->parent_color = rbt->root->parent_color | 1;
  return;
}

Assistant:

void rb_insert_fixup(lgx_rb_t *rbt, lgx_rb_node_t *node) {  
    lgx_rb_node_t *parent, *gparent;  
  
    while ((parent = rb_parent(node)) && rb_is_red(parent)) {
        gparent = rb_parent(parent); 
  
        if (parent == gparent->left) {  
            {
                register lgx_rb_node_t *uncle = gparent->right; 
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);
                    rb_set_black(parent);
                    rb_set_red(gparent);
                    node = gparent;
                    continue;
                }  
            }
  
            if (parent->right == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_left(rbt, parent);
                tmp = parent;
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);
            rb_set_red(gparent);
            rb_rotate_right(rbt, gparent);
        } else {
            {
                register lgx_rb_node_t *uncle = gparent->left;  
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);  
                    rb_set_black(parent);  
                    rb_set_red(gparent);  
                    node = gparent;  
                    continue;  
                }
            }
  
            if (parent->left == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_right(rbt, parent);  
                tmp = parent;  
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);  
            rb_set_red(gparent);  
            rb_rotate_left(rbt, gparent);  
        }
    }
  
    rb_set_black(rbt->root);  
}